

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::TreeEnsembleParameters::TreeEnsembleParameters(TreeEnsembleParameters *this)

{
  TreeEnsembleParameters *pTVar1;
  TreeEnsembleParameters *this_local;
  
  google::protobuf::MessageLite::MessageLite(&this->super_MessageLite);
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__TreeEnsembleParameters_00d5dc88;
  google::protobuf::internal::InternalMetadataWithArenaLite::InternalMetadataWithArenaLite
            (&this->_internal_metadata_,(Arena *)0x0);
  google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode>::
  RepeatedPtrField(&this->nodes_);
  google::protobuf::RepeatedField<double>::RepeatedField(&this->basepredictionvalue_);
  pTVar1 = internal_default_instance();
  if (this != pTVar1) {
    protobuf_TreeEnsemble_2eproto::InitDefaults();
  }
  SharedCtor(this);
  return;
}

Assistant:

TreeEnsembleParameters::TreeEnsembleParameters()
  : ::google::protobuf::MessageLite(), _internal_metadata_(NULL) {
  if (GOOGLE_PREDICT_TRUE(this != internal_default_instance())) {
    protobuf_TreeEnsemble_2eproto::InitDefaults();
  }
  SharedCtor();
  // @@protoc_insertion_point(constructor:CoreML.Specification.TreeEnsembleParameters)
}